

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_substr_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  bool bVar1;
  uint uVar2;
  sxi32 sVar3;
  char *pBlob;
  char *pPattern;
  jx9_value *pjVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  int nTextlen;
  int nPatlen;
  sxu32 nOfft;
  uint local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  if (1 < nArg) {
    pBlob = jx9_value_to_string(*apArg,(int *)&local_3c);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_38);
    if (((0 < (int)local_3c) && (0 < (int)local_38)) && ((int)local_38 <= (int)local_3c)) {
      if (nArg != 2) {
        pjVar4 = apArg[2];
        jx9MemObjToInteger(pjVar4);
        uVar2 = (uint)(pjVar4->x).iVal;
        if (((int)uVar2 < 0) || ((int)local_3c < (int)uVar2)) {
          pjVar4 = pCtx->pRet;
          jx9MemObjRelease(pjVar4);
          (pjVar4->x).rVal = 0.0;
          pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
          bVar1 = false;
        }
        else {
          pBlob = pBlob + (uVar2 & 0x7fffffff);
          bVar1 = true;
          local_3c = local_3c - uVar2;
        }
        if (!bVar1) {
          return 0;
        }
      }
      uVar6 = (ulong)(int)local_3c;
      if (3 < nArg) {
        pjVar4 = apArg[3];
        jx9MemObjToInteger(pjVar4);
        uVar2 = (uint)(pjVar4->x).iVal;
        if ((int)local_3c < (int)uVar2 || (int)uVar2 < 0) {
          pjVar4 = pCtx->pRet;
          jx9MemObjRelease(pjVar4);
          (pjVar4->x).rVal = 0.0;
          pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
          return 0;
        }
        uVar6 = (ulong)(uVar2 & 0x7fffffff);
        local_3c = uVar2;
      }
      pcVar7 = pBlob + uVar6;
      iVar5 = 0;
      do {
        sVar3 = SyBlobSearch(pBlob,(int)pcVar7 - (int)pBlob,pPattern,local_38,&local_34);
        if (sVar3 != 0) break;
        iVar5 = iVar5 + 1;
        pBlob = pBlob + (local_38 + local_34);
      } while (pBlob < pcVar7);
      pjVar4 = pCtx->pRet;
      jx9MemObjRelease(pjVar4);
      pjVar4->x = (anon_union_8_3_18420de5_for_x)(long)iVar5;
      goto LAB_00130077;
    }
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
LAB_00130077:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_substr_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zText, *zPattern, *zEnd;
	int nTextlen, nPatlen;
	int iCount = 0;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the haystack */
	zText = jx9_value_to_string(apArg[0], &nTextlen);
	/* Point to the neddle */
	zPattern = jx9_value_to_string(apArg[1], &nPatlen);
	if( nTextlen < 1 || nPatlen < 1 || nPatlen > nTextlen ){
		/* NOOP, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 || nOfft > nTextlen ){
			/* Invalid offset, return zero */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Point to the desired offset */
		zText = &zText[nOfft];
		/* Adjust length */
		nTextlen -= nOfft;
	}
	/* Point to the end of the string */
	zEnd = &zText[nTextlen];
	if( nArg > 3 ){
		int nLen;
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 0 || nLen > nTextlen ){
			/* Invalid length, return 0 */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Adjust pointer */
		nTextlen = nLen;
		zEnd = &zText[nTextlen];
	}
	/* Perform the search */
	for(;;){
		rc = SyBlobSearch((const void *)zText, (sxu32)(zEnd-zText), (const void *)zPattern, nPatlen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, break immediately */
			break;
		}
		/* Increment counter and update the offset */
		iCount++;
		zText += nOfft + nPatlen;
		if( zText >= zEnd ){
			break;
		}
	}
	/* Pattern count */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}